

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_utils.c
# Opt level: O2

int WebPRescalerExport(WebPRescaler *rescaler)

{
  int total_exported;
  int iVar1;
  
  iVar1 = 0;
  while ((rescaler->dst_y < rescaler->dst_height && (rescaler->y_accum < 1))) {
    WebPRescalerExportRow(rescaler);
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int WebPRescalerExport(WebPRescaler* const rescaler) {
  int total_exported = 0;
  while (WebPRescalerHasPendingOutput(rescaler)) {
    WebPRescalerExportRow(rescaler);
    ++total_exported;
  }
  return total_exported;
}